

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XObjectContentContext.cpp
# Opt level: O1

void __thiscall FormImageWritingTask::~FormImageWritingTask(FormImageWritingTask *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_IFormEndWritingTask)._vptr_IFormEndWritingTask =
       (_func_int **)&PTR__FormImageWritingTask_003acc78;
  pcVar1 = (this->mPDFParsingOptions).Password._M_dataplus._M_p;
  paVar2 = &(this->mPDFParsingOptions).Password.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->mImagePath)._M_dataplus._M_p;
  paVar2 = &(this->mImagePath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~FormImageWritingTask(){}